

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSONChildren.cpp
# Opt level: O2

void jsonChildren::reserve2(jsonChildren **mine,json_index_t amount)

{
  jsonChildren *pjVar1;
  uint uVar2;
  JSONNode **ppJVar3;
  uint uVar4;
  uint uVar5;
  size_t count;
  
  pjVar1 = *mine;
  if (pjVar1->array == (JSONNode **)0x0) {
    pjVar1->mycapacity = amount;
    ppJVar3 = (JSONNode **)malloc((ulong)amount << 3);
    pjVar1->array = ppJVar3;
    return;
  }
  uVar5 = amount - pjVar1->mycapacity;
  if (pjVar1->mycapacity <= amount && uVar5 != 0) {
    if (uVar5 != 0) {
      uVar2 = pjVar1->mysize + uVar5;
      uVar4 = pjVar1->mycapacity;
      if (uVar4 <= uVar2) {
        if (uVar4 == 0) {
          count = 8;
          if (8 < uVar5) {
            count = (size_t)uVar5;
          }
          ppJVar3 = json_malloc<JSONNode*>(count);
          pjVar1->array = ppJVar3;
          pjVar1->mycapacity = (json_index_t)count;
        }
        else {
          while (uVar4 < uVar2) {
            uVar4 = uVar4 * 2;
            pjVar1->mycapacity = uVar4;
          }
          ppJVar3 = json_realloc<JSONNode*>(pjVar1->array,(ulong)uVar4);
          pjVar1->array = ppJVar3;
        }
      }
    }
    return;
  }
  return;
}

Assistant:

void jsonChildren::reserve2(jsonChildren *& mine, json_index_t amount) json_nothrow {
    if (mine -> array != 0){
	   if (mine -> mycapacity < amount){
		  mine -> inc(amount - mine -> mycapacity);
		  #ifdef JSON_LESS_MEMORY
			 mine = jsonChildren_Reserved::newChildren_Reserved(mine, amount);
		  #endif
	   }
    } else {
	   mine -> reserve(amount);
    }
}